

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

Log * __thiscall FIX::ScreenLogFactory::create(ScreenLogFactory *this,SessionID *sessionID)

{
  bool bVar1;
  Dictionary *pDVar2;
  ScreenLog *this_00;
  bool event;
  bool outgoing;
  bool incoming;
  Dictionary settings;
  
  settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  settings._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001ee780;
  settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settings.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settings.m_name._M_dataplus._M_p = (pointer)&settings.m_name.field_2;
  settings.m_name._M_string_length = 0;
  settings.m_name.field_2._M_local_buf[0] = '\0';
  settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settings.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = SessionSettings::has(&this->m_settings,sessionID);
  if (bVar1) {
    pDVar2 = SessionSettings::get(&this->m_settings,sessionID);
    Dictionary::operator=(&settings,pDVar2);
  }
  init(this,(EVP_PKEY_CTX *)&settings);
  this_00 = (ScreenLog *)operator_new(0x48);
  ScreenLog::ScreenLog(this_00,sessionID,incoming,outgoing,event);
  Dictionary::~Dictionary(&settings);
  return &this_00->super_Log;
}

Assistant:

Log* ScreenLogFactory::create( const SessionID& sessionID )
{
  Dictionary settings;
  if( m_settings.has(sessionID) ) 
    settings = m_settings.get( sessionID );

  bool incoming, outgoing, event;
  init( settings, incoming, outgoing, event );
  return new ScreenLog( sessionID, incoming, outgoing, event );
}